

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int allocate_ack_eliciting_frame
              (quicly_conn_t *conn,quicly_send_context_t *s,size_t min_space,quicly_sent_t **sent,
              quicly_sent_acked_cb acked)

{
  int iVar1;
  quicly_sent_t *pqVar2;
  
  iVar1 = _do_allocate_frame(conn,s,min_space,1);
  if (iVar1 == 0) {
    pqVar2 = quicly_sentmap_allocate(&(conn->egress).loss.sentmap,acked);
    *sent = pqVar2;
    iVar1 = 0x201;
    if (pqVar2 != (quicly_sent_t *)0x0) {
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int allocate_ack_eliciting_frame(quicly_conn_t *conn, quicly_send_context_t *s, size_t min_space, quicly_sent_t **sent,
                                        quicly_sent_acked_cb acked)
{
    int ret;

    if ((ret = _do_allocate_frame(conn, s, min_space, 1)) != 0)
        return ret;
    if ((*sent = quicly_sentmap_allocate(&conn->egress.loss.sentmap, acked)) == NULL)
        return PTLS_ERROR_NO_MEMORY;

    return ret;
}